

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall CGL::PathTracer::~PathTracer(PathTracer *this)

{
  if (this->gridSampler != (Sampler2D *)0x0) {
    (*this->gridSampler->_vptr_Sampler2D[1])();
  }
  if (this->hemisphereSampler != (Sampler3D *)0x0) {
    (*this->hemisphereSampler->_vptr_Sampler3D[1])();
  }
  std::_Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::~_Vector_base
            (&(this->flare_radiance).
              super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>);
  std::_Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::~_Vector_base
            (&(this->flare_origins).
              super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->sampleCountBuffer).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::~_Vector_base
            (&(this->sampleBuffer).data.
              super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>);
  std::_Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::~_Vector_base
            (&(this->ghost_buffer).data.
              super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>);
  return;
}

Assistant:

PathTracer::~PathTracer() {
  delete gridSampler;
  delete hemisphereSampler;
}